

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void __thiscall kj::anon_unknown_36::WebSocketPipeImpl::BlockedSend::abort(BlockedSend *this)

{
  PromiseFulfiller<void> *pPVar1;
  WebSocketPipeImpl *this_00;
  char *pcVar2;
  size_t sVar3;
  char (*in_RCX) [41];
  StringPtr cancelReason;
  String local_1c8;
  Exception local_1b0;
  
  cancelReason.content.size_ = 0x29;
  cancelReason.content.ptr = "other end of WebSocketPipe was destroyed";
  Canceler::cancel(&this->canceler,cancelReason);
  pPVar1 = this->fulfiller;
  kj::_::Debug::makeDescription<char_const(&)[41]>
            (&local_1c8,(Debug *)"\"other end of WebSocketPipe was destroyed\"",
             "other end of WebSocketPipe was destroyed",in_RCX);
  Exception::Exception
            (&local_1b0,DISCONNECTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0xf9c,&local_1c8);
  (**(pPVar1->super_PromiseRejector)._vptr_PromiseRejector)(pPVar1,&local_1b0);
  Exception::~Exception(&local_1b0);
  sVar3 = local_1c8.content.size_;
  pcVar2 = local_1c8.content.ptr;
  if (local_1c8.content.ptr != (char *)0x0) {
    local_1c8.content.ptr = (char *)0x0;
    local_1c8.content.size_ = 0;
    (**(local_1c8.content.disposer)->_vptr_ArrayDisposer)
              (local_1c8.content.disposer,pcVar2,1,sVar3,sVar3,0);
  }
  this_00 = this->pipe;
  if ((BlockedSend *)(this_00->state).ptr == this) {
    (this_00->state).ptr = (WebSocket *)0x0;
  }
  WebSocketPipeImpl::abort(this_00);
  return;
}

Assistant:

void abort() override {
      canceler.cancel("other end of WebSocketPipe was destroyed");
      fulfiller.reject(KJ_EXCEPTION(DISCONNECTED, "other end of WebSocketPipe was destroyed"));
      pipe.endState(*this);
      pipe.abort();
    }